

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O2

Vec_Int_t *
Gia_PolynCoreOrder(Gia_Man_t *pGia,Vec_Int_t *vAdds,Vec_Int_t *vAddCos,Vec_Int_t **pvIns,
                  Vec_Int_t **pvOuts)

{
  int iVar1;
  Vec_Wec_t *vMap;
  Vec_Int_t *vRoots;
  Gia_Obj_t *pObj;
  Vec_Int_t *pVVar2;
  int *__dest;
  int iVar3;
  size_t __size;
  
  vMap = Gia_PolynComputeMap(vAdds,pGia->nObjs);
  vRoots = Vec_IntAlloc(pGia->vCos->nSize);
  for (iVar3 = 0; iVar3 < pGia->vCos->nSize; iVar3 = iVar3 + 1) {
    pObj = Gia_ManCo(pGia,iVar3);
    iVar1 = Gia_ObjFaninId0p(pGia,pObj);
    Vec_IntPush(vRoots,iVar1);
  }
  if (vAddCos != (Vec_Int_t *)0x0) {
    for (iVar3 = 0; iVar3 < vAddCos->nSize; iVar3 = iVar3 + 1) {
      iVar1 = Vec_IntEntry(vAddCos,iVar3);
      Vec_IntPush(vRoots,iVar1);
    }
  }
  if (pvOuts != (Vec_Int_t **)0x0) {
    pVVar2 = (Vec_Int_t *)malloc(0x10);
    iVar3 = vRoots->nSize;
    pVVar2->nSize = iVar3;
    pVVar2->nCap = iVar3;
    if ((long)iVar3 == 0) {
      __size = 0;
      __dest = (int *)0x0;
    }
    else {
      __size = (long)iVar3 << 2;
      __dest = (int *)malloc(__size);
    }
    pVVar2->pArray = __dest;
    memcpy(__dest,vRoots->pArray,__size);
    *pvOuts = pVVar2;
  }
  pVVar2 = Gia_PolynCoreOrder_int(pGia,vAdds,vMap,vRoots,pvIns);
  Vec_IntFree(vRoots);
  Vec_WecFree(vMap);
  printf("Collected %d boxes.\n",(ulong)(uint)pVVar2->nSize);
  return pVVar2;
}

Assistant:

Vec_Int_t * Gia_PolynCoreOrder( Gia_Man_t * pGia, Vec_Int_t * vAdds, Vec_Int_t * vAddCos, Vec_Int_t ** pvIns, Vec_Int_t ** pvOuts )
{
    Vec_Int_t * vOrder;
    Vec_Wec_t * vMap = Gia_PolynComputeMap( vAdds, Gia_ManObjNum(pGia) );
    Vec_Int_t * vRoots = Vec_IntAlloc( Gia_ManCoNum(pGia) );
    int i, Driver;
    // collect roots
    Gia_ManForEachCoDriverId( pGia, Driver, i )
        Vec_IntPush( vRoots, Driver );
    // collect additional outputs
    if ( vAddCos )
        Vec_IntForEachEntry( vAddCos, Driver, i )
            Vec_IntPush( vRoots, Driver );
    // remember roots
    if ( pvOuts )
        *pvOuts = Vec_IntDup( vRoots );
    // create order
    vOrder = Gia_PolynCoreOrder_int( pGia, vAdds, vMap, vRoots, pvIns );
    Vec_IntFree( vRoots );
    Vec_WecFree( vMap );
    printf( "Collected %d boxes.\n", Vec_IntSize(vOrder) );
    return vOrder;
}